

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-sampling.cpp
# Opt level: O2

void __thiscall
sampler_tester::sampler_tester
          (sampler_tester *this,vector<float,_std::allocator<float>_> *probs,
          vector<float,_std::allocator<float>_> *probs_expected)

{
  pointer pfVar1;
  pointer plVar2;
  pointer plVar3;
  llama_token token_id;
  long lVar4;
  llama_token_data local_3c;
  
  std::vector<float,_std::allocator<float>_>::vector(&this->probs_expected,probs_expected);
  (this->cur).super__Vector_base<llama_token_data,_std::allocator<llama_token_data>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->cur).super__Vector_base<llama_token_data,_std::allocator<llama_token_data>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->cur).super__Vector_base<llama_token_data,_std::allocator<llama_token_data>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<llama_token_data,_std::allocator<llama_token_data>_>::reserve
            (&this->cur,
             (long)(probs->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(probs->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 2);
  for (lVar4 = 0;
      pfVar1 = (probs->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_start,
      lVar4 < (int)((ulong)((long)(probs->super__Vector_base<float,_std::allocator<float>_>)._M_impl
                                  .super__Vector_impl_data._M_finish - (long)pfVar1) >> 2);
      lVar4 = lVar4 + 1) {
    local_3c.logit = logf(pfVar1[lVar4]);
    local_3c.id = (llama_token)lVar4;
    local_3c.p = (probs->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                 super__Vector_impl_data._M_start[lVar4];
    std::vector<llama_token_data,_std::allocator<llama_token_data>_>::emplace_back<llama_token_data>
              (&this->cur,&local_3c);
  }
  plVar2 = (this->cur).super__Vector_base<llama_token_data,_std::allocator<llama_token_data>_>.
           _M_impl.super__Vector_impl_data._M_start;
  plVar3 = (this->cur).super__Vector_base<llama_token_data,_std::allocator<llama_token_data>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  (this->cur_p).data = plVar2;
  (this->cur_p).size = ((long)plVar3 - (long)plVar2) / 0xc;
  (this->cur_p).selected = -1;
  (this->cur_p).sorted = false;
  return;
}

Assistant:

sampler_tester(const std::vector<float> & probs, const std::vector<float> & probs_expected) : probs_expected(probs_expected) {
        cur.reserve(probs.size());
        for (llama_token token_id = 0; token_id < (llama_token)probs.size(); token_id++) {
            const float logit = logf(probs[token_id]);
            cur.emplace_back(llama_token_data{token_id, logit, probs[token_id]});
        }

        cur_p = llama_token_data_array { cur.data(), cur.size(), -1, false };
    }